

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xxhash.cpp
# Opt level: O3

uint duckdb_zstd::XXH32(void *input,size_t len,uint seed)

{
  byte *pbVar1;
  uint uVar2;
  uint uVar3;
  byte *pbVar4;
  uint uVar5;
  int iVar6;
  uint uVar7;
  uint uVar8;
  uint uVar9;
  
  pbVar1 = (byte *)((long)input + len);
  if (len < 0x10) {
    iVar6 = seed + 0x165667b1;
  }
  else {
    iVar6 = seed + 0x24234428;
    uVar5 = seed + 0x85ebca77;
    uVar2 = seed + 0x61c8864f;
    do {
      uVar7 = *input * -0x7a143589 + iVar6;
      uVar8 = uVar7 * 0x2000 | uVar7 >> 0x13;
      uVar5 = *(int *)((long)input + 4) * -0x7a143589 + uVar5;
      uVar7 = uVar5 * 0x2000 | uVar5 >> 0x13;
      iVar6 = uVar8 * -0x61c8864f;
      uVar5 = *(int *)((long)input + 8) * -0x7a143589 + seed;
      uVar9 = uVar5 * 0x2000 | uVar5 >> 0x13;
      uVar5 = uVar7 * -0x61c8864f;
      uVar2 = *(int *)((long)input + 0xc) * -0x7a143589 + uVar2;
      uVar3 = uVar2 * 0x2000 | uVar2 >> 0x13;
      seed = uVar9 * -0x61c8864f;
      uVar2 = uVar3 * -0x61c8864f;
      input = (void *)((long)input + 0x10);
    } while (input <= pbVar1 + -0x10);
    iVar6 = (uVar3 * -0x193c0000 | uVar2 >> 0xe) + (uVar9 * 0x779b1000 | seed >> 0x14) +
            (uVar7 * 0x1bbcd880 | uVar5 >> 0x19) + (uVar8 * 0x3c6ef362 | (uint)(iVar6 < 0));
  }
  uVar2 = (int)len + iVar6;
  pbVar4 = (byte *)((long)input + 4);
  while (pbVar4 <= pbVar1) {
    uVar2 = *input * -0x3d4d51c3 + uVar2;
    uVar2 = (uVar2 * 0x20000 | uVar2 >> 0xf) * 0x27d4eb2f;
    pbVar4 = (byte *)((long)input + 8);
    input = (byte *)((long)input + 4);
  }
  for (; input < pbVar1; input = (void *)((long)input + 1)) {
    uVar2 = (uint)*input * 0x165667b1 + uVar2;
    uVar2 = (uVar2 * 0x800 | uVar2 >> 0x15) * -0x61c8864f;
  }
  uVar2 = (uVar2 >> 0xf ^ uVar2) * -0x7a143589;
  uVar2 = (uVar2 >> 0xd ^ uVar2) * -0x3d4d51c3;
  return uVar2 >> 0x10 ^ uVar2;
}

Assistant:

XXH_PUBLIC_API unsigned int XXH32 (const void* input, size_t len, unsigned int seed)
{
#if 0
    /* Simple version, good for code maintenance, but unfortunately slow for small inputs */
    XXH32_CREATESTATE_STATIC(state);
    XXH32_reset(state, seed);
    XXH32_update(state, input, len);
    return XXH32_digest(state);
#else
    XXH_endianess endian_detected = (XXH_endianess)XXH_CPU_LITTLE_ENDIAN;

    if (XXH_FORCE_ALIGN_CHECK) {
        if ((((size_t)input) & 3) == 0) {   /* Input is 4-bytes aligned, leverage the speed benefit */
            if ((endian_detected==XXH_littleEndian) || XXH_FORCE_NATIVE_FORMAT)
                return XXH32_endian_align(input, len, seed, XXH_littleEndian, XXH_aligned);
            else
                return XXH32_endian_align(input, len, seed, XXH_bigEndian, XXH_aligned);
    }   }

    if ((endian_detected==XXH_littleEndian) || XXH_FORCE_NATIVE_FORMAT)
        return XXH32_endian_align(input, len, seed, XXH_littleEndian, XXH_unaligned);
    else
        return XXH32_endian_align(input, len, seed, XXH_bigEndian, XXH_unaligned);
#endif
}